

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall chrono::ChAssembly::ChAssembly(ChAssembly *this,ChAssembly *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChAssembly_00b11428;
  (this->linklist).
  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bodylist).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bodylist).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bodylist).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shaftlist).
  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shaftlist).
  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shaftlist).
  super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->linklist).
  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->linklist).
  super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshlist).
  super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->otherphysicslist).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->batch_to_insert).
  super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = other->ndoc_w_D;
  this->ndoc_w_C = other->ndoc_w_C;
  this->ndoc_w_D = iVar1;
  iVar1 = other->nbodies_sleep;
  iVar2 = other->nbodies_fixed;
  iVar3 = other->nshafts;
  iVar4 = other->nshafts_sleep;
  iVar5 = other->nshafts_fixed;
  iVar6 = other->nlinks;
  iVar7 = other->nmeshes;
  iVar8 = other->nphysicsitems;
  iVar9 = other->ncoords;
  iVar10 = other->ndoc;
  iVar11 = other->nsysvars;
  iVar12 = other->ncoords_w;
  iVar13 = other->ndoc_w;
  iVar14 = other->nsysvars_w;
  iVar15 = other->ndof;
  this->nbodies = other->nbodies;
  this->nbodies_sleep = iVar1;
  this->nbodies_fixed = iVar2;
  this->nshafts = iVar3;
  this->nshafts_sleep = iVar4;
  this->nshafts_fixed = iVar5;
  this->nlinks = iVar6;
  this->nmeshes = iVar7;
  this->nphysicsitems = iVar8;
  this->ncoords = iVar9;
  this->ndoc = iVar10;
  this->nsysvars = iVar11;
  this->ncoords_w = iVar12;
  this->ndoc_w = iVar13;
  this->nsysvars_w = iVar14;
  this->ndof = iVar15;
  return;
}

Assistant:

ChAssembly::ChAssembly(const ChAssembly& other) : ChPhysicsItem(other) {
    nbodies = other.nbodies;
    nbodies_sleep = other.nbodies_sleep;
    nbodies_fixed = other.nbodies_fixed;
    nshafts = other.nshafts;
    nshafts_sleep = other.nshafts_sleep;
    nshafts_fixed = other.nshafts_fixed;
    nlinks = other.nlinks;
    nmeshes = other.nmeshes;
    nphysicsitems = other.nphysicsitems;
    ncoords = other.ncoords;
    ncoords_w = other.ncoords_w;
    ndoc = other.ndoc;
    ndoc_w = other.ndoc_w;
    ndoc_w_C = other.ndoc_w_C;
    ndoc_w_D = other.ndoc_w_D;
    ndof = other.ndof;
    nsysvars = other.nsysvars;
    nsysvars_w = other.nsysvars_w;

    //// RADU
    //// TODO:  deep copy of the object lists (bodylist, shaftlist, linklist, meshlist,  otherphysicslist)
}